

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::AtomicFenceExpr,_std::default_delete<wabt::AtomicFenceExpr>_> __thiscall
wabt::MakeUnique<wabt::AtomicFenceExpr,unsigned_int&>(wabt *this,uint *args)

{
  uint32_t consistency_model;
  AtomicFenceExpr *this_00;
  Location local_38;
  uint32_t *local_18;
  uint *args_local;
  
  local_18 = args;
  args_local = (uint *)this;
  this_00 = (AtomicFenceExpr *)operator_new(0x40);
  consistency_model = *local_18;
  Location::Location(&local_38);
  AtomicFenceExpr::AtomicFenceExpr(this_00,consistency_model,&local_38);
  std::unique_ptr<wabt::AtomicFenceExpr,std::default_delete<wabt::AtomicFenceExpr>>::
  unique_ptr<std::default_delete<wabt::AtomicFenceExpr>,void>
            ((unique_ptr<wabt::AtomicFenceExpr,std::default_delete<wabt::AtomicFenceExpr>> *)this,
             this_00);
  return (__uniq_ptr_data<wabt::AtomicFenceExpr,_std::default_delete<wabt::AtomicFenceExpr>,_true,_true>
          )(__uniq_ptr_data<wabt::AtomicFenceExpr,_std::default_delete<wabt::AtomicFenceExpr>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}